

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedString::GenerateAccessorDeclarations
          (RepeatedString *this,Printer *p)

{
  FieldDescriptor *pFVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v_01;
  Printer *pPVar2;
  bool bVar3;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_01;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  Semantic local_1e4;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> *local_1c8;
  undefined8 local_1c0;
  FieldDescriptor *local_1b8;
  pointer local_1b0;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_1a8;
  Span<const_google::protobuf::io::Printer::Sub> local_190;
  undefined1 local_180 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v3;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_160;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  undefined8 local_148;
  char *pcStack_140;
  iterator local_138;
  undefined8 local_130;
  FieldDescriptor *local_128;
  pointer local_120;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_118;
  Span<const_google::protobuf::io::Printer::Sub> local_100;
  undefined1 local_f0 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  undefined8 local_a8;
  char *pcStack_a0;
  iterator local_90;
  undefined8 local_88;
  FieldDescriptor *local_80;
  pointer local_78;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_70;
  Span<const_google::protobuf::io::Printer::Sub> local_58;
  undefined1 local_48 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  RepeatedString *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar3 = protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors
                    ((this->super_FieldGeneratorBase).field_);
  pPVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"\n      private:  // Hidden due to unknown ctype option.\n    ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar2,local_28._M_len,local_28._M_str);
  }
  pPVar2 = local_18;
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  local_a8 = 10;
  pcStack_a0 = "_internal_";
  local_b8._M_len = 0;
  local_b8._M_str = "";
  local_90 = &local_b8;
  local_88 = 2;
  v_01._M_len = 2;
  v_01._M_array = local_90;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_80,v_01);
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_c0);
  prefixes.len_._0_4_ = local_c0._M_payload;
  prefixes.len_._4_1_ = local_c0._M_engaged;
  prefixes.len_._5_3_ = local_c0._5_3_;
  prefixes.ptr_ = local_78;
  AnnotatedAccessors(&local_70,(cpp *)pFVar1,local_80,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_58,&local_70);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_48,pPVar2,local_58);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_70);
  pPVar2 = local_18;
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  local_148 = 4;
  pcStack_140 = "add_";
  local_158._M_len = 4;
  local_158._M_str = "set_";
  local_138 = &local_158;
  local_130 = 2;
  v_00._M_len = 2;
  v_00._M_array = local_138;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_128,v_00);
  v3.storage_.callback_buffer_[0xc] = '\x01';
  v3.storage_.callback_buffer_[0xd] = '\0';
  v3.storage_.callback_buffer_[0xe] = '\0';
  v3.storage_.callback_buffer_[0xf] = '\0';
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_160,
             (Semantic *)(v3.storage_.callback_buffer_ + 0xc));
  prefixes_00.len_._0_4_ = local_160._M_payload;
  prefixes_00.len_._4_1_ = local_160._M_engaged;
  prefixes_00.len_._5_3_ = local_160._5_3_;
  prefixes_00.ptr_ = local_120;
  AnnotatedAccessors(&local_118,(cpp *)pFVar1,local_128,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_100,&local_118);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_f0,pPVar2,local_100);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_118);
  pPVar2 = local_18;
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"mutable_");
  local_1c0 = 1;
  v._M_len = 1;
  v._M_array = &local_1d8;
  local_1c8 = &local_1d8;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_1b8,v);
  local_1e4 = kAlias;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_1e0,&local_1e4)
  ;
  prefixes_01.len_._0_4_ = local_1e0._M_payload;
  prefixes_01.len_._4_1_ = local_1e0._M_engaged;
  prefixes_01.len_._5_3_ = local_1e0._5_3_;
  prefixes_01.ptr_ = local_1b0;
  AnnotatedAccessors(&local_1a8,(cpp *)pFVar1,local_1b8,prefixes_01,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_190,&local_1a8);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_180,pPVar2,local_190);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1f8,
             "\n    $DEPRECATED$ const ::std::string& $name$(int index) const;\n    $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$(int index);\n    template <typename Arg_ = const ::std::string&, typename... Args_>\n    $DEPRECATED$ void set_$name$(int index, Arg_&& value, Args_... args);\n    $DEPRECATED$ ::std::string* $nonnull$ $add_name$();\n    template <typename Arg_ = const ::std::string&, typename... Args_>\n    $DEPRECATED$ void $add_name$(Arg_&& value, Args_... args);\n    $DEPRECATED$ const $pb$::RepeatedPtrField<::std::string>& $name$() const;\n    $DEPRECATED$ $pb$::RepeatedPtrField<::std::string>* $nonnull$ $mutable_name$();\n\n    private:\n    const $pb$::RepeatedPtrField<::std::string>& _internal_$name$() const;\n    $pb$::RepeatedPtrField<::std::string>* $nonnull$ _internal_mutable_$name$();\n\n    public:\n  "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(pPVar2,local_1f8._M_len,local_1f8._M_str);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_180);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_f0);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_48);
  return;
}

Assistant:

void RepeatedString::GenerateAccessorDeclarations(io::Printer* p) const {
  if (internal::cpp::IsStringFieldWithPrivatizedAccessors(*field_)) {
    p->Emit(R"cc(
      private:  // Hidden due to unknown ctype option.
    )cc");
  }

  auto v1 = p->WithVars(AnnotatedAccessors(field_, {"", "_internal_"}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_", "add_"}, AnnotationCollector::kSet));
  auto v3 = p->WithVars(
      AnnotatedAccessors(field_, {"mutable_"}, AnnotationCollector::kAlias));

  p->Emit(R"cc(
    $DEPRECATED$ const ::std::string& $name$(int index) const;
    $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$(int index);
    template <typename Arg_ = const ::std::string&, typename... Args_>
    $DEPRECATED$ void set_$name$(int index, Arg_&& value, Args_... args);
    $DEPRECATED$ ::std::string* $nonnull$ $add_name$();
    template <typename Arg_ = const ::std::string&, typename... Args_>
    $DEPRECATED$ void $add_name$(Arg_&& value, Args_... args);
    $DEPRECATED$ const $pb$::RepeatedPtrField<::std::string>& $name$() const;
    $DEPRECATED$ $pb$::RepeatedPtrField<::std::string>* $nonnull$ $mutable_name$();

    private:
    const $pb$::RepeatedPtrField<::std::string>& _internal_$name$() const;
    $pb$::RepeatedPtrField<::std::string>* $nonnull$ _internal_mutable_$name$();

    public:
  )cc");
}